

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_l10n.c
# Opt level: O2

void test_l10n_nested(CuTest *tc)

{
  l10n_text *plVar1;
  char *actual;
  l10n_text txt;
  char buffer [32];
  
  txt.format = (char *)0x0;
  txt.refcount = 0;
  txt._12_4_ = 0;
  txt.args = (l10n_arg *)0x0;
  plVar1 = l10n_text_build("$name!","$name","Hodor",0);
  l10n_text_assign(&txt,"@name @name! @name!!","@name",plVar1,0);
  actual = l10n_text_render(&txt,buffer,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x4d,(char *)0x0,buffer,actual);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x4e,(char *)0x0,"Hodor! Hodor!! Hodor!!!",buffer);
  l10n_text_free(&txt);
  plVar1 = l10n_text_release(plVar1);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x51,(char *)0x0,(void *)0x0,plVar1);
  return;
}

Assistant:

static void test_l10n_nested(CuTest * tc)
{
    char buffer[32];
    l10n_text txt = { NULL, 0, 0 };
    l10n_text *sub;

    sub = l10n_text_build("$name!", "$name", "Hodor", NULL);
    l10n_text_assign(&txt, "@name @name! @name!!", "@name", sub, NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "Hodor! Hodor!! Hodor!!!", buffer);
    l10n_text_free(&txt);
    sub = l10n_text_release(sub);
    CuAssertPtrEquals(tc, NULL, sub);
}